

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.cpp
# Opt level: O0

int __thiscall
uv11::getaddrinfo(uv11 *this,char *__name,char *__service,addrinfo *__req,addrinfo **__pai)

{
  uv_loop_t *puVar1;
  uv_getaddrinfo_s *puVar2;
  _func_void_uv_getaddrinfo_t_ptr_int_addrinfo_ptr *p_Var3;
  error_code eVar4;
  __0 local_45;
  int local_44;
  addrinfo **ppaStack_40;
  int s;
  char *service_local;
  char *node_local;
  GetAddrInfoCb *callback_local;
  GetAddrInfoRequest *req_local;
  Loop *loop_local;
  
  ppaStack_40 = __pai;
  service_local = (char *)__req;
  node_local = __service;
  callback_local = (GetAddrInfoCb *)__name;
  req_local = (GetAddrInfoRequest *)this;
  std::function<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr)>::operator=
            ((function<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr)> *)
             (__name + 0xa8),
             (function<void_(uv11::GetAddrInfoRequest_&,_std::error_code,_uv11::UvAddrInfoPtr)> *)
             __service);
  puVar1 = Loop::Get((Loop *)req_local);
  puVar2 = WrappedObject<uv_getaddrinfo_s>::Get((WrappedObject<uv_getaddrinfo_s> *)callback_local);
  p_Var3 = getaddrinfo(uv11::Loop&,uv11::GetAddrInfoRequest&,std::function_const&,char_const*,char_const*)
           ::$_0::operator_cast_to_function_pointer(&local_45);
  local_44 = uv_getaddrinfo(puVar1,puVar2,p_Var3,service_local,ppaStack_40,0);
  eVar4 = make_error(local_44);
  return eVar4._M_value;
}

Assistant:

Error uv11::getaddrinfo(
    Loop& loop,
    GetAddrInfoRequest& req,
    GetAddrInfoCb const& callback,
    char const* node, char const* service
) {
    req.getaddrinfo_cb = callback;
    int s = ::uv_getaddrinfo(
        &loop.Get(),
        &req.Get(),
        [](uv_getaddrinfo_t* req_ptr, int status, struct addrinfo* res){
            GetAddrInfoRequest* r = reinterpret_cast<GetAddrInfoRequest*>(req_ptr->data);
            r->getaddrinfo_cb(*r, make_error(status), UvAddrInfoPtr(res));
        },
        node, service,
        nullptr
    );

    return make_error(s);
}